

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

bool __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::EndObject(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            *this,SizeType memberCount)

{
  char *pcVar1;
  GenericMember<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *members;
  
  members = internal::Stack<rapidjson::CrtAllocator>::
            Pop<rapidjson::GenericMember<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                      (&this->stack_,(ulong)memberCount);
  pcVar1 = (this->stack_).stackTop_;
  if ((ulong)((long)pcVar1 - (long)(this->stack_).stack_) < 0x10) {
    __assert_fail("GetSize() >= sizeof(T)",
                  "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/internal/stack.h"
                  ,0x92,
                  "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Top() [Allocator = rapidjson::CrtAllocator, T = rapidjson::GenericValue<rapidjson::UTF8<>>]"
                 );
  }
  if (this->allocator_ != (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0) {
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    SetObjectRaw((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)(pcVar1 + -0x10),members,memberCount,this->allocator_);
    return true;
  }
  __assert_fail("allocator_",
                "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/document.h"
                ,0xaec,
                "Allocator &rapidjson::GenericDocument<rapidjson::UTF8<>>::GetAllocator() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>, StackAllocator = rapidjson::CrtAllocator]"
               );
}

Assistant:

bool EndObject(SizeType memberCount) {
        typename ValueType::Member* members = stack_.template Pop<typename ValueType::Member>(memberCount);
        stack_.template Top<ValueType>()->SetObjectRaw(members, memberCount, GetAllocator());
        return true;
    }